

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_window_is_hovered(nk_context *ctx)

{
  nk_context *ctx_local;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x4041,"int nk_window_is_hovered(struct nk_context *)");
  }
  if (ctx->current != (nk_window *)0x0) {
    if ((ctx == (nk_context *)0x0) || (ctx->current == (nk_window *)0x0)) {
      ctx_local._4_4_ = 0;
    }
    else if ((ctx->current->flags & 0x2000) == 0) {
      ctx_local._4_4_ = nk_input_is_mouse_hovering_rect(&ctx->input,ctx->current->bounds);
    }
    else {
      ctx_local._4_4_ = 0;
    }
    return ctx_local._4_4_;
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x4042,"int nk_window_is_hovered(struct nk_context *)");
}

Assistant:

NK_API int
nk_window_is_hovered(struct nk_context *ctx)
{
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current) return 0;
    if(ctx->current->flags & NK_WINDOW_HIDDEN)
        return 0;
    return nk_input_is_mouse_hovering_rect(&ctx->input, ctx->current->bounds);
}